

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FieldDescriptorProto::Swap(FieldDescriptorProto *this,FieldDescriptorProto *other)

{
  int32 iVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  FieldOptions *pFVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  
  if (other != this) {
    psVar4 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar4;
    iVar1 = this->number_;
    this->number_ = other->number_;
    other->number_ = iVar1;
    iVar2 = this->label_;
    this->label_ = other->label_;
    other->label_ = iVar2;
    iVar2 = this->type_;
    this->type_ = other->type_;
    other->type_ = iVar2;
    psVar4 = this->type_name_;
    this->type_name_ = other->type_name_;
    other->type_name_ = psVar4;
    psVar4 = this->extendee_;
    this->extendee_ = other->extendee_;
    other->extendee_ = psVar4;
    psVar4 = this->default_value_;
    this->default_value_ = other->default_value_;
    other->default_value_ = psVar4;
    pFVar5 = this->options_;
    this->options_ = other->options_;
    other->options_ = pFVar5;
    uVar3 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar3;
    pvVar6 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar6;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void FieldDescriptorProto::Swap(FieldDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(number_, other->number_);
    std::swap(label_, other->label_);
    std::swap(type_, other->type_);
    std::swap(type_name_, other->type_name_);
    std::swap(extendee_, other->extendee_);
    std::swap(default_value_, other->default_value_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}